

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataController.cpp
# Opt level: O0

void __thiscall Rml::DataControllers::Add(DataControllers *this,DataControllerPtr *controller)

{
  code *pcVar1;
  bool bVar2;
  pointer this_00;
  Element *local_20;
  Element *element;
  DataControllerPtr *controller_local;
  DataControllers *this_local;
  
  element = (Element *)controller;
  controller_local = (DataControllerPtr *)this;
  bVar2 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)controller);
  if ((!bVar2) &&
     (bVar2 = Assert("RMLUI_ASSERT(controller)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataController.cpp"
                     ,0x36), !bVar2)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  this_00 = ::std::unique_ptr<Rml::DataController,_Rml::Releaser<Rml::DataController>_>::operator->
                      (controller);
  local_20 = DataController::GetElement(this_00);
  if ((local_20 == (Element *)0x0) &&
     (bVar2 = Assert("Invalid controller, make sure it is valid before adding",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataController.cpp"
                     ,0x39), !bVar2)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  if (local_20 != (Element *)0x0) {
    ::std::
    unordered_multimap<Rml::Element*,std::unique_ptr<Rml::DataController,Rml::Releaser<Rml::DataController>>,std::hash<Rml::Element*>,std::equal_to<Rml::Element*>,std::allocator<std::pair<Rml::Element*const,std::unique_ptr<Rml::DataController,Rml::Releaser<Rml::DataController>>>>>
    ::
    emplace<Rml::Element*&,std::unique_ptr<Rml::DataController,Rml::Releaser<Rml::DataController>>>
              ((unordered_multimap<Rml::Element*,std::unique_ptr<Rml::DataController,Rml::Releaser<Rml::DataController>>,std::hash<Rml::Element*>,std::equal_to<Rml::Element*>,std::allocator<std::pair<Rml::Element*const,std::unique_ptr<Rml::DataController,Rml::Releaser<Rml::DataController>>>>>
                *)this,&local_20,controller);
  }
  return;
}

Assistant:

void DataControllers::Add(DataControllerPtr controller)
{
	RMLUI_ASSERT(controller);

	Element* element = controller->GetElement();
	RMLUI_ASSERTMSG(element, "Invalid controller, make sure it is valid before adding");
	if (!element)
		return;

	controllers.emplace(element, std::move(controller));
}